

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O1

bool __thiscall DListMenu::Responder(DListMenu *this,event_t *ev)

{
  FListMenuItem *pFVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  FListMenuDescriptor *pFVar5;
  FSoundID *sound_id;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  FSoundID local_30;
  FSoundID local_2c;
  
  if ((ev->type == '\x04') && (ev->subtype == '\x01')) {
    uVar3 = tolower((int)ev->data1);
    uVar7 = this->mDesc->mSelectedItem;
    uVar6 = (ulong)(uVar7 + 1);
    do {
      uVar7 = uVar7 + 1;
      if ((this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count <= uVar7) {
        pFVar5 = this->mDesc;
        if (pFVar5->mSelectedItem < 1) goto LAB_003077e0;
        lVar8 = 0;
        goto LAB_003077bc;
      }
      pFVar1 = (this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar6];
      iVar4 = (*pFVar1->_vptr_FListMenuItem[0xf])(pFVar1,(ulong)uVar3);
      uVar6 = uVar6 + 1;
    } while ((char)iVar4 == '\0');
    this->mDesc->mSelectedItem = uVar7;
    iVar4 = S_FindSound("menu/cursor");
    sound_id = &local_2c;
LAB_0030780c:
    sound_id->ID = iVar4;
    S_Sound(0x22,sound_id,snd_menuvolume.Value,0.0);
    return true;
  }
LAB_003077e0:
  bVar2 = DMenu::Responder(&this->super_DMenu,ev);
  return bVar2;
  while (lVar8 = lVar8 + 1, lVar8 < pFVar5->mSelectedItem) {
LAB_003077bc:
    pFVar1 = (pFVar5->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[lVar8];
    iVar4 = (*pFVar1->_vptr_FListMenuItem[0xf])(pFVar1,(ulong)uVar3);
    pFVar5 = this->mDesc;
    if ((char)iVar4 != '\0') {
      pFVar5->mSelectedItem = (int)lVar8;
      iVar4 = S_FindSound("menu/cursor");
      sound_id = &local_30;
      goto LAB_0030780c;
    }
  }
  goto LAB_003077e0;
}

Assistant:

bool DListMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_KeyDown)
		{
			int ch = tolower (ev->data1);

			for(unsigned i = mDesc->mSelectedItem + 1; i < mDesc->mItems.Size(); i++)
			{
				if (mDesc->mItems[i]->CheckHotkey(ch))
				{
					mDesc->mSelectedItem = i;
					S_Sound(CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
					return true;
				}
			}
			for(int i = 0; i < mDesc->mSelectedItem; i++)
			{
				if (mDesc->mItems[i]->CheckHotkey(ch))
				{
					mDesc->mSelectedItem = i;
					S_Sound(CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
					return true;
				}
			}
		}
	}
	return Super::Responder(ev);
}